

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

T __thiscall adios2::VariableNT::Max(VariableNT *this,size_t step)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  ulong *in_RDI;
  undefined8 uVar4;
  T TVar5;
  T ret;
  allocator *__rhs;
  allocator *__lhs;
  string local_130 [20];
  int in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string *in_stack_ffffffffffffff58;
  VariableBase *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [48];
  ulong local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"in call to VariableNT::Max",&local_41);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (*(int *)(*in_RDI + 0x28) == 1) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar1 = adios2::core::Variable<signed_char>::Max(*in_RDI);
    local_10 = CONCAT71(local_10._1_7_,uVar1);
    TVar5._8_8_ = extraout_RDX;
    TVar5.Int64 = local_10;
  }
  else if (*(int *)(*in_RDI + 0x28) == 5) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar1 = adios2::core::Variable<unsigned_char>::Max(*in_RDI);
    local_10 = CONCAT71(local_10._1_7_,uVar1);
    TVar5._8_8_ = extraout_RDX_00;
    TVar5.Int64 = local_10;
  }
  else if (*(int *)(*in_RDI + 0x28) == 2) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar2 = adios2::core::Variable<short>::Max(*in_RDI);
    local_10 = CONCAT62(local_10._2_6_,uVar2);
    TVar5._8_8_ = extraout_RDX_01;
    TVar5.Int64 = local_10;
  }
  else if (*(int *)(*in_RDI + 0x28) == 6) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar2 = adios2::core::Variable<unsigned_short>::Max(*in_RDI);
    local_10 = CONCAT62(local_10._2_6_,uVar2);
    TVar5._8_8_ = extraout_RDX_02;
    TVar5.Int64 = local_10;
  }
  else if (*(int *)(*in_RDI + 0x28) == 3) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar3 = adios2::core::Variable<int>::Max(*in_RDI);
    local_10 = CONCAT44(local_10._4_4_,uVar3);
    TVar5._8_8_ = extraout_RDX_03;
    TVar5.Int64 = local_10;
  }
  else if (*(int *)(*in_RDI + 0x28) == 7) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar3 = adios2::core::Variable<unsigned_int>::Max(*in_RDI);
    local_10 = CONCAT44(local_10._4_4_,uVar3);
    TVar5._8_8_ = extraout_RDX_04;
    TVar5.Int64 = local_10;
  }
  else if (*(int *)(*in_RDI + 0x28) == 4) {
    local_10 = (ulong)local_10._1_7_ << 8;
    TVar5 = (T)adios2::core::Variable<long>::Max(*in_RDI);
  }
  else if (*(int *)(*in_RDI + 0x28) == 8) {
    local_10 = (ulong)local_10._1_7_ << 8;
    TVar5 = (T)adios2::core::Variable<unsigned_long>::Max(*in_RDI);
  }
  else if (*(int *)(*in_RDI + 0x28) == 9) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar3 = adios2::core::Variable<float>::Max(*in_RDI);
    local_10 = CONCAT44(local_10._4_4_,uVar3);
    TVar5._8_8_ = extraout_RDX_05;
    TVar5.Int64 = local_10;
  }
  else if (*(int *)(*in_RDI + 0x28) == 10) {
    local_10 = (ulong)local_10._1_7_ << 8;
    uVar4 = adios2::core::Variable<double>::Max(*in_RDI);
    TVar5._8_8_ = extraout_RDX_06;
    TVar5.Int64 = uVar4;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"bindings::CXX11",&local_79);
    __lhs = (allocator *)&stack0xffffffffffffff5f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff60,"VariableNT",__lhs);
    __rhs = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Max",__rhs);
    adios2::ToString_abi_cxx11_((DataType)local_130);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)__rhs);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_10 = local_10 & 0xffffffffffffff00;
    TVar5._8_8_ = extraout_RDX_07;
    TVar5.UInt64 = local_10;
  }
  return TVar5;
}

Assistant:

VariableNT::T VariableNT::Max(const size_t step) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::Max");
    if (m_Variable->m_Type == DataType::Int8)
    {
        VariableNT::T ret = {0};
        ret.Int8 = reinterpret_cast<core::Variable<int8_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt8)
    {
        VariableNT::T ret = {0};
        ret.UInt8 = reinterpret_cast<core::Variable<uint8_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int16)
    {
        VariableNT::T ret = {0};
        ret.Int16 = reinterpret_cast<core::Variable<int16_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt16)
    {
        VariableNT::T ret = {0};
        ret.UInt16 = reinterpret_cast<core::Variable<uint16_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int32)
    {
        VariableNT::T ret = {0};
        ret.Int32 = reinterpret_cast<core::Variable<int32_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt32)
    {
        VariableNT::T ret = {0};
        ret.UInt32 = reinterpret_cast<core::Variable<uint32_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int64)
    {
        VariableNT::T ret = {0};
        ret.Int64 = reinterpret_cast<core::Variable<int64_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt64)
    {
        VariableNT::T ret = {0};
        ret.UInt64 = reinterpret_cast<core::Variable<uint64_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Float)
    {
        VariableNT::T ret = {0};
        ret.Float = reinterpret_cast<core::Variable<float> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Double)
    {
        VariableNT::T ret = {0};
        ret.Double = reinterpret_cast<core::Variable<double> *>(m_Variable)->Max(step);
        return ret;
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "Max",
                                      "invalid data type " + ToString(m_Variable->m_Type) +
                                          ", only basic numeric types support this API");
    return {0};
}